

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::set_port_filter(session_impl *this,port_filter *f)

{
  pointer psVar1;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar2;
  
  port_filter::operator=(&this->m_port_filter,f);
  psVar1 = (this->m_torrents).m_array.
           super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->m_torrents).m_array.
                super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    torrent::port_filter_updated
              ((psVar2->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
  }
  return;
}

Assistant:

void session_impl::set_port_filter(port_filter const& f)
	{
		m_port_filter = f;
		// Close connections whose endpoint is filtered
		// by the new port-filter
		for (auto const& t : m_torrents)
			t->port_filter_updated();
	}